

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

void schedule_itimer(int msec)

{
  int *piVar1;
  int in_EDI;
  bool bVar2;
  itimerval val;
  int ret;
  itimerval local_28;
  int local_8;
  int local_4;
  
  local_4 = in_EDI;
  memset(&local_28,0,0x20);
  local_28.it_value.tv_sec = (__time_t)(local_4 / 1000);
  local_28.it_value.tv_usec = (__suseconds_t)((local_4 % 1000) * 1000);
  s.sig_alrm = 0;
  do {
    local_8 = setitimer(ITIMER_REAL,&local_28,(itimerval *)0x0);
    bVar2 = false;
    if (local_8 < 0) {
      piVar1 = __errno_location();
      bVar2 = *piVar1 == 4;
    }
  } while (bVar2);
  if (local_8 < 0) {
    err(1,"setitimer %i msec",local_4);
  }
  return;
}

Assistant:

static void schedule_itimer(int msec)
{
	int ret;
	struct itimerval val = { 0 };

	val.it_value.tv_sec = msec / 1000;
	val.it_value.tv_usec = (msec % 1000) * 1000;

	s.sig_alrm = 0;
	do {
		ret = setitimer(ITIMER_REAL, &val, NULL);
	} while ((ret < 0) && (errno == EINTR));
	if (ret < 0)
		err(1, "setitimer %i msec", msec);
}